

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre.cc
# Opt level: O2

bool __thiscall
re2::PCRE::DoMatch(PCRE *this,StringPiece *text,Anchor anchor,int *consumed,Arg **args,int n)

{
  bool bVar1;
  int *vec;
  uint vecsize;
  
  if (-1 < n) {
    vecsize = n * 3 + 3;
    vec = (int *)operator_new__((ulong)vecsize * 4);
    bVar1 = DoMatchImpl(this,text,anchor,consumed,args,n,vec,vecsize);
    operator_delete__(vec);
    return bVar1;
  }
  __assert_fail("n >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/pcre.cc",
                0x27b,
                "bool re2::PCRE::DoMatch(const StringPiece &, Anchor, int *, const Arg *const *, int) const"
               );
}

Assistant:

bool PCRE::DoMatch(const StringPiece& text,
                 Anchor anchor,
                 int* consumed,
                 const Arg* const args[],
                 int n) const {
  assert(n >= 0);
  const int vecsize = (1 + n) * 3;  // results + PCRE workspace
                                    // (as for kVecSize)
  int* vec = new int[vecsize];
  bool b = DoMatchImpl(text, anchor, consumed, args, n, vec, vecsize);
  delete[] vec;
  return b;
}